

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O0

size_t ZSTD_compress(void *dst,size_t dstCapacity,void *src,size_t srcSize,int compressionLevel)

{
  ZSTD_customMem memManager;
  size_t sVar1;
  ZSTD_CCtx ctxBody;
  size_t result;
  int compressionLevel_00;
  ZSTD_CCtx *in_stack_ffffffffffffeb50;
  void *in_stack_ffffffffffffeb58;
  void *in_stack_ffffffffffffeb60;
  void *in_stack_ffffffffffffeb68;
  ZSTD_CCtx *in_stack_ffffffffffffeb70;
  
  compressionLevel_00 = 0;
  memManager.customFree = (ZSTD_freeFunction)in_stack_ffffffffffffeb58;
  memManager.customAlloc = (ZSTD_allocFunction)in_stack_ffffffffffffeb50;
  memManager.opaque = in_stack_ffffffffffffeb60;
  ZSTD_initCCtx((ZSTD_CCtx *)(ZSTD_freeFunction)0x0,memManager);
  sVar1 = ZSTD_compressCCtx(in_stack_ffffffffffffeb70,in_stack_ffffffffffffeb68,
                            (size_t)in_stack_ffffffffffffeb60,in_stack_ffffffffffffeb58,
                            (size_t)in_stack_ffffffffffffeb50,compressionLevel_00);
  ZSTD_freeCCtxContent(in_stack_ffffffffffffeb50);
  return sVar1;
}

Assistant:

size_t ZSTD_compress(void* dst, size_t dstCapacity,
               const void* src, size_t srcSize,
                     int compressionLevel)
{
    size_t result;
#if ZSTD_COMPRESS_HEAPMODE
    ZSTD_CCtx* cctx = ZSTD_createCCtx();
    RETURN_ERROR_IF(!cctx, memory_allocation, "ZSTD_createCCtx failed");
    result = ZSTD_compressCCtx(cctx, dst, dstCapacity, src, srcSize, compressionLevel);
    ZSTD_freeCCtx(cctx);
#else
    ZSTD_CCtx ctxBody;
    ZSTD_initCCtx(&ctxBody, ZSTD_defaultCMem);
    result = ZSTD_compressCCtx(&ctxBody, dst, dstCapacity, src, srcSize, compressionLevel);
    ZSTD_freeCCtxContent(&ctxBody);   /* can't free ctxBody itself, as it's on stack; free only heap content */
#endif
    return result;
}